

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient3d(double *pa,double *pb,double *pc,double *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint elen;
  int iVar4;
  int iVar5;
  int flen;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  double *e;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dStack_1088;
  double dStack_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double dStack_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  double dStack_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  double dStack_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  double dStack_1000;
  double dStack_ff8;
  double dStack_ff0;
  double dStack_fe8;
  double dStack_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double dStack_fc0;
  double dStack_fb8;
  double dStack_fb0;
  double dStack_fa8;
  double dStack_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  double dStack_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  double dStack_f60;
  double dStack_f58;
  double dStack_f50;
  double dStack_f48;
  double dStack_f40;
  double dStack_f38;
  double dStack_f30;
  double dStack_f28;
  double dStack_f20;
  double adStack_f18 [16];
  double adStack_e98 [12];
  double adStack_e38 [8];
  double adStack_df8 [8];
  double adStack_db8 [8];
  double adStack_d78 [8];
  double adStack_d38 [8];
  double adStack_cf8 [8];
  double adStack_cb8 [16];
  double adStack_c38 [192];
  double adStack_638 [193];
  
  dVar25 = splitter;
  dVar13 = *pd;
  dVar26 = pd[1];
  dVar30 = pd[2];
  dVar45 = (*pb - dVar13) * (pc[1] - dVar26);
  dVar43 = (pb[1] - dVar26) * (*pc - dVar13);
  dVar41 = (*pc - dVar13) * (pa[1] - dVar26);
  dVar38 = (pc[1] - dVar26) * (*pa - dVar13);
  dVar31 = (pb[1] - dVar26) * (*pa - dVar13);
  dVar26 = (*pb - dVar13) * (pa[1] - dVar26);
  dVar13 = (dVar31 - dVar26) * (pc[2] - dVar30) +
           (dVar45 - dVar43) * (pa[2] - dVar30) + (dVar41 - dVar38) * (pb[2] - dVar30);
  if ((_use_inexact_arith != 0) ||
     ((_use_static_filter != 0 && ((o3dstaticfilter < dVar13 || (dVar13 < -o3dstaticfilter)))))) {
    return dVar13;
  }
  dVar26 = ABS(pc[2] - dVar30) * (ABS(dVar26) + ABS(dVar31)) +
           ABS(pa[2] - dVar30) * (ABS(dVar43) + ABS(dVar45)) +
           ABS(pb[2] - dVar30) * (ABS(dVar38) + ABS(dVar41));
  if (o3derrboundA * dVar26 < dVar13) {
    return dVar13;
  }
  if (o3derrboundA * dVar26 < -dVar13) {
    return dVar13;
  }
  dVar13 = *pd;
  dVar30 = pd[1];
  dVar31 = *pb;
  dVar11 = dVar31 - dVar13;
  dVar38 = *pc;
  dVar41 = pc[1];
  dVar32 = dVar41 - dVar30;
  dVar46 = dVar11 * dVar32;
  dVar20 = dVar11 * splitter - (dVar11 * splitter - dVar11);
  dVar27 = dVar11 - dVar20;
  dVar35 = dVar32 * splitter - (dVar32 * splitter - dVar32);
  dVar39 = dVar32 - dVar35;
  dVar45 = dVar27 * dVar39 - (((dVar46 - dVar20 * dVar35) - dVar27 * dVar35) - dVar20 * dVar39);
  dVar21 = dVar38 - dVar13;
  dVar14 = dVar21 * splitter - (dVar21 * splitter - dVar21);
  dVar43 = pb[1];
  dVar15 = dVar43 - dVar30;
  dStack_1068 = dVar15 * splitter - (dVar15 * splitter - dVar15);
  dStack_f80 = dVar21 * dVar15;
  dVar36 = dVar21 - dVar14;
  dStack_1060 = dVar15 - dStack_1068;
  dVar12 = dVar36 * dStack_1060 -
           (((dStack_f80 - dVar14 * dStack_1068) - dVar36 * dStack_1068) - dVar14 * dStack_1060);
  dVar16 = dVar45 - dVar12;
  dStack_f38 = (dVar45 - (dVar16 + (dVar45 - dVar16))) + ((dVar45 - dVar16) - dVar12);
  dVar45 = *pa;
  dVar12 = pa[1];
  dVar22 = pa[2];
  dVar23 = pd[2];
  dVar24 = pb[2];
  dVar34 = pc[2];
  dVar10 = dVar46 + dVar16;
  dVar16 = (dVar46 - (dVar10 - (dVar10 - dVar46))) + (dVar16 - (dVar10 - dVar46));
  dVar17 = dVar16 - dStack_f80;
  dStack_f30 = (dVar16 - (dVar17 + (dVar16 - dVar17))) + ((dVar16 - dVar17) - dStack_f80);
  dStack_f20 = dVar10 + dVar17;
  dStack_f28 = (dVar10 - (dStack_f20 - (dStack_f20 - dVar10))) + (dVar17 - (dStack_f20 - dVar10));
  dVar44 = dVar45 - dVar13;
  dVar42 = dVar12 - dVar30;
  dVar10 = dVar22 - dVar23;
  dVar37 = dVar24 - dVar23;
  dVar33 = dVar34 - dVar23;
  iVar1 = scale_expansion_zeroelim(4,&dStack_f38,dVar10,adStack_d78);
  dStack_f88 = dVar21 * dVar42;
  dVar18 = dVar42 * dVar25 - (dVar42 * dVar25 - dVar42);
  dVar28 = dVar42 - dVar18;
  dVar16 = dVar36 * dVar28 - (((dStack_f88 - dVar14 * dVar18) - dVar36 * dVar18) - dVar14 * dVar28);
  dStack_f90 = dVar44 * dVar32;
  dVar29 = dVar44 * dVar25 - (dVar44 * dVar25 - dVar44);
  dVar40 = dVar44 - dVar29;
  dVar17 = dVar40 * dVar39 - (((dStack_f90 - dVar29 * dVar35) - dVar40 * dVar35) - dVar29 * dVar39);
  dVar19 = dVar16 - dVar17;
  dStack_f58 = (dVar16 - (dVar19 + (dVar16 - dVar19))) + ((dVar16 - dVar19) - dVar17);
  dVar16 = dStack_f88 + dVar19;
  dVar17 = (dStack_f88 - (dVar16 - (dVar16 - dStack_f88))) + (dVar19 - (dVar16 - dStack_f88));
  dVar19 = dVar17 - dStack_f90;
  dStack_f50 = (dVar17 - (dVar19 + (dVar17 - dVar19))) + ((dVar17 - dVar19) - dStack_f90);
  dStack_f40 = dVar16 + dVar19;
  dStack_f48 = (dVar16 - (dStack_f40 - (dStack_f40 - dVar16))) + (dVar19 - (dStack_f40 - dVar16));
  iVar2 = scale_expansion_zeroelim(4,&dStack_f58,dVar37,adStack_cf8);
  dVar19 = dVar44 * dVar15;
  dVar40 = dVar40 * dStack_1060 -
           (((dVar19 - dVar29 * dStack_1068) - dVar40 * dStack_1068) - dVar29 * dStack_1060);
  dVar29 = dVar11 * dVar42;
  dVar16 = dVar28 * dVar27 - (((dVar29 - dVar20 * dVar18) - dVar18 * dVar27) - dVar20 * dVar28);
  dVar17 = dVar40 - dVar16;
  dStack_f78 = (dVar40 - (dVar17 + (dVar40 - dVar17))) + ((dVar40 - dVar17) - dVar16);
  dVar16 = dVar19 + dVar17;
  dVar18 = (dVar19 - (dVar16 - (dVar16 - dVar19))) + (dVar17 - (dVar16 - dVar19));
  dVar17 = dVar18 - dVar29;
  dStack_f70 = (dVar18 - (dVar17 + (dVar18 - dVar17))) + ((dVar18 - dVar17) - dVar29);
  dStack_f60 = dVar16 + dVar17;
  dStack_f68 = (dVar16 - (dStack_f60 - (dStack_f60 - dVar16))) + (dVar17 - (dStack_f60 - dVar16));
  iVar3 = scale_expansion_zeroelim(4,&dStack_f78,dVar33,adStack_d38);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,adStack_d78,iVar2,adStack_cf8,adStack_cb8);
  pdVar7 = adStack_c38;
  elen = fast_expansion_sum_zeroelim(iVar1,adStack_cb8,iVar3,adStack_d38,pdVar7);
  if (1 < (int)elen) {
    uVar6 = 1;
    do {
      adStack_c38[0] = adStack_c38[0] + adStack_c38[uVar6];
      uVar6 = uVar6 + 1;
    } while (elen != uVar6);
  }
  if (o3derrboundB * dVar26 <= adStack_c38[0]) {
    return adStack_c38[0];
  }
  if (o3derrboundB * dVar26 <= -adStack_c38[0]) {
    return adStack_c38[0];
  }
  dVar45 = (dVar45 - (dVar44 + (dVar45 - dVar44))) + ((dVar45 - dVar44) - dVar13);
  dVar17 = (dVar31 - (dVar11 + (dVar31 - dVar11))) + ((dVar31 - dVar11) - dVar13);
  dVar16 = (dVar38 - (dVar21 + (dVar38 - dVar21))) + ((dVar38 - dVar21) - dVar13);
  dVar12 = (dVar12 - (dVar42 + (dVar12 - dVar42))) + ((dVar12 - dVar42) - dVar30);
  dVar38 = (dVar43 - (dVar15 + (dVar43 - dVar15))) + ((dVar43 - dVar15) - dVar30);
  dVar41 = (dVar41 - (dVar32 + (dVar41 - dVar32))) + ((dVar41 - dVar32) - dVar30);
  dVar31 = (dVar22 - (dVar10 + (dVar22 - dVar10))) + ((dVar22 - dVar10) - dVar23);
  dVar30 = (dVar24 - (dVar37 + (dVar24 - dVar37))) + ((dVar24 - dVar37) - dVar23);
  dVar13 = (dVar34 - (dVar33 + (dVar34 - dVar33))) + ((dVar34 - dVar33) - dVar23);
  if ((((((dVar45 == 0.0) && (!NAN(dVar45))) && (dVar17 == 0.0)) &&
       ((!NAN(dVar17) && (dVar16 == 0.0)))) &&
      (((!NAN(dVar16) && ((dVar12 == 0.0 && (!NAN(dVar12))))) && (dVar38 == 0.0)))) &&
     (((((!NAN(dVar38) && (dVar41 == 0.0)) && (!NAN(dVar41))) &&
       (((dVar31 == 0.0 && (!NAN(dVar31))) &&
        ((dVar30 == 0.0 && ((!NAN(dVar30) && (dVar13 == 0.0)))))))) && (!NAN(dVar13))))) {
    return adStack_c38[0];
  }
  dVar28 = dVar26 * o3derrboundC + ABS(adStack_c38[0]) * resulterrbound;
  dVar43 = dVar17 * dVar32;
  dVar26 = dVar11 * dVar41;
  dStack_f98 = dVar21 * dVar38;
  dVar22 = dVar15 * dVar16;
  dVar23 = dVar42 * dVar16;
  dVar49 = dVar21 * dVar12;
  dVar24 = dVar44 * dVar41;
  dVar40 = dVar32 * dVar45;
  dVar47 = dVar45 * dVar15;
  dVar34 = dVar44 * dVar38;
  dVar48 = dVar11 * dVar12;
  dVar18 = dVar42 * dVar17;
  adStack_c38[0] =
       ((dVar34 + dVar47) - (dVar18 + dVar48)) * dVar33 + (dVar19 - dVar29) * dVar13 +
       ((dVar49 + dVar23) - (dVar40 + dVar24)) * dVar37 + (dStack_f88 - dStack_f90) * dVar30 +
       ((dVar26 + dVar43) - (dVar22 + dStack_f98)) * dVar10 + (dVar46 - dStack_f80) * dVar31 +
       adStack_c38[0];
  if (dVar28 <= adStack_c38[0]) {
    return adStack_c38[0];
  }
  if (dVar28 <= -adStack_c38[0]) {
    return adStack_c38[0];
  }
  if ((dVar45 != 0.0) || (NAN(dVar45))) {
    dVar28 = dVar45 * dVar25 - (dVar45 * dVar25 - dVar45);
    dVar19 = dVar45 - dVar28;
    dStack_fb8 = dStack_1060 * dVar19 -
                 (((dVar47 - dVar28 * dStack_1068) - dStack_1068 * dVar19) - dVar28 * dStack_1060);
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dVar29 = dVar25 * dVar12 - (dVar25 * dVar12 - dVar12);
      dVar46 = dVar12 - dVar29;
      dVar25 = dVar27 * dVar46 - (((dVar48 - dVar29 * dVar20) - dVar20 * dVar46) - dVar29 * dVar27);
      dVar20 = dStack_fb8 - dVar25;
      dStack_fb8 = (dStack_fb8 - (dVar20 + (dStack_fb8 - dVar20))) +
                   ((dStack_fb8 - dVar20) - dVar25);
      dVar27 = dVar47 + dVar20;
      dVar20 = (dVar47 - (dVar27 - (dVar27 - dVar47))) + (dVar20 - (dVar27 - dVar47));
      dVar25 = dVar20 - dVar48;
      dStack_fb0 = (dVar20 - (dVar25 + (dVar20 - dVar25))) + ((dVar20 - dVar25) - dVar48);
      dStack_fa0 = dVar27 + dVar25;
      dStack_fa8 = (dVar27 - (dStack_fa0 - (dStack_fa0 - dVar27))) +
                   (dVar25 - (dStack_fa0 - dVar27));
      dVar20 = dVar46 * dVar36 - (((dVar49 - dVar29 * dVar14) - dVar14 * dVar46) - dVar29 * dVar36);
      dVar25 = dVar19 * dVar39 - (-dVar28 * dVar39 + -dVar19 * dVar35 + -dVar28 * dVar35 + dVar40);
      dVar14 = dVar20 - dVar25;
      dStack_fd8 = (dVar20 - (dVar14 + (dVar20 - dVar14))) + ((dVar20 - dVar14) - dVar25);
      dVar25 = dVar49 + dVar14;
      dVar19 = (dVar49 - (dVar25 - (dVar25 - dVar49))) + (dVar14 - (dVar25 - dVar49));
      dVar14 = dVar19 - dVar40;
      dStack_fd0 = (dVar19 - (dVar14 + (dVar19 - dVar14))) + ((dVar19 - dVar14) - dVar40);
      dStack_fc0 = dVar25 + dVar14;
      dStack_fc8 = (dVar25 - (dStack_fc0 - (dStack_fc0 - dVar25))) +
                   (dVar14 - (dStack_fc0 - dVar25));
      iVar1 = 4;
    }
    else {
      dVar14 = -dVar45;
      dVar25 = dVar25 * dVar14 - (dVar45 + dVar25 * dVar14);
      dStack_fd8 = (dVar14 - dVar25) * dVar39 -
                   (((dVar32 * dVar14 - dVar25 * dVar35) - dVar35 * (dVar14 - dVar25)) -
                   dVar25 * dVar39);
      iVar1 = 2;
      dStack_fd0 = dVar32 * dVar14;
      dStack_fb0 = dVar47;
    }
  }
  else if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar19 = -dVar12;
    dStack_fb0 = dVar11 * dVar19;
    dVar28 = dVar25 * dVar19 - (dVar12 + dVar25 * dVar19);
    dStack_fb8 = (dVar19 - dVar28) * dVar27 -
                 (((dStack_fb0 - dVar28 * dVar20) - dVar20 * (dVar19 - dVar28)) - dVar28 * dVar27);
    dVar25 = dVar25 * dVar12 - (dVar25 * dVar12 - dVar12);
    dStack_fd8 = (dVar12 - dVar25) * dVar36 -
                 (((dVar49 - dVar25 * dVar14) - dVar14 * (dVar12 - dVar25)) - dVar25 * dVar36);
    iVar1 = 2;
    dStack_fd0 = dVar49;
  }
  else {
    dStack_fb8 = 0.0;
    dStack_fd8 = 0.0;
    iVar1 = 1;
  }
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    dVar14 = dVar17 * splitter - (dVar17 * splitter - dVar17);
    dVar19 = dVar17 - dVar14;
    dVar25 = dVar32 * splitter - (dVar32 * splitter - dVar32);
    dStack_ff8 = (dVar32 - dVar25) * dVar19 -
                 (((dVar43 - dVar14 * dVar25) - dVar25 * dVar19) - dVar14 * (dVar32 - dVar25));
    if ((dVar38 == 0.0) && (!NAN(dVar38))) {
      dVar18 = -dVar17;
      dVar34 = dVar42 * dVar18;
      dVar25 = splitter * dVar18 - (dVar17 + splitter * dVar18);
      dVar14 = dVar42 * splitter - (dVar42 * splitter - dVar42);
      dStack_1018 = (dVar42 - dVar14) * (dVar18 - dVar25) -
                    (((dVar34 - dVar25 * dVar14) - dVar14 * (dVar18 - dVar25)) -
                    dVar25 * (dVar42 - dVar14));
      dStack_ff0 = dVar43;
      goto LAB_0015c1f0;
    }
    dVar27 = dVar38 * splitter - (dVar38 * splitter - dVar38);
    dVar28 = dVar38 - dVar27;
    dVar25 = dVar21 * splitter - (dVar21 * splitter - dVar21);
    dVar20 = (dVar21 - dVar25) * dVar28 -
             (((dStack_f98 - dVar27 * dVar25) - dVar25 * dVar28) - dVar27 * (dVar21 - dVar25));
    dVar25 = dStack_ff8 - dVar20;
    dStack_ff8 = (dStack_ff8 - (dVar25 + (dStack_ff8 - dVar25))) + ((dStack_ff8 - dVar25) - dVar20);
    dVar20 = dVar43 + dVar25;
    dVar43 = (dVar43 - (dVar20 - (dVar20 - dVar43))) + (dVar25 - (dVar20 - dVar43));
    dVar25 = dVar43 - dStack_f98;
    dStack_ff0 = (dVar43 - (dVar25 + (dVar43 - dVar25))) + ((dVar43 - dVar25) - dStack_f98);
    dStack_fe0 = dVar20 + dVar25;
    dStack_fe8 = (dVar20 - (dStack_fe0 - (dStack_fe0 - dVar20))) + (dVar25 - (dStack_fe0 - dVar20));
    dVar25 = dVar44 * splitter - (dVar44 * splitter - dVar44);
    dVar20 = (dVar44 - dVar25) * dVar28 -
             (((dVar34 - dVar27 * dVar25) - dVar25 * dVar28) - dVar27 * (dVar44 - dVar25));
    dVar25 = splitter * dVar42 - (splitter * dVar42 - dVar42);
    dVar25 = (dVar42 - dVar25) * dVar19 -
             (-dVar14 * (dVar42 - dVar25) + dVar25 * -dVar19 + -dVar14 * dVar25 + dVar18);
    dVar43 = dVar20 - dVar25;
    dStack_1018 = (dVar20 - (dVar43 + (dVar20 - dVar43))) + ((dVar20 - dVar43) - dVar25);
    dVar25 = dVar34 + dVar43;
    dVar34 = (dVar34 - (dVar25 - (dVar25 - dVar34))) + (dVar43 - (dVar25 - dVar34));
    dVar43 = dVar34 - dVar18;
    dStack_1010 = (dVar34 - (dVar43 + (dVar34 - dVar43))) + ((dVar34 - dVar43) - dVar18);
    dStack_1000 = dVar25 + dVar43;
    dStack_1008 = (dVar25 - (dStack_1000 - (dStack_1000 - dVar25))) +
                  (dVar43 - (dStack_1000 - dVar25));
    iVar2 = 4;
  }
  else if ((dVar38 != 0.0) || (NAN(dVar38))) {
    dVar14 = -dVar38;
    dVar25 = splitter * dVar14 - (dVar38 + splitter * dVar14);
    dVar43 = dVar21 * splitter - (dVar21 * splitter - dVar21);
    dStack_ff8 = (dVar21 - dVar43) * (dVar14 - dVar25) -
                 (((dVar21 * dVar14 - dVar25 * dVar43) - dVar43 * (dVar14 - dVar25)) -
                 dVar25 * (dVar21 - dVar43));
    dVar43 = dVar38 * splitter - (dVar38 * splitter - dVar38);
    dVar25 = splitter * dVar44 - (splitter * dVar44 - dVar44);
    dStack_1018 = (dVar44 - dVar25) * (dVar38 - dVar43) -
                  (((dVar34 - dVar43 * dVar25) - dVar25 * (dVar38 - dVar43)) -
                  dVar43 * (dVar44 - dVar25));
    dStack_ff0 = dVar21 * dVar14;
LAB_0015c1f0:
    iVar2 = 2;
    dStack_1010 = dVar34;
  }
  else {
    dStack_ff8 = 0.0;
    dStack_1018 = 0.0;
    iVar2 = 1;
  }
  if ((dVar16 != 0.0) || (NAN(dVar16))) {
    dVar43 = dVar16 * splitter - (dVar16 * splitter - dVar16);
    dVar34 = dVar16 - dVar43;
    dVar25 = dVar42 * splitter - (dVar42 * splitter - dVar42);
    dStack_1038 = (dVar42 - dVar25) * dVar34 -
                  (((dVar23 - dVar43 * dVar25) - dVar25 * dVar34) - dVar43 * (dVar42 - dVar25));
    if ((dVar41 != 0.0) || (NAN(dVar41))) {
      dVar14 = dVar41 * splitter - (dVar41 * splitter - dVar41);
      dVar18 = dVar41 - dVar14;
      dVar25 = dVar44 * splitter - (dVar44 * splitter - dVar44);
      dVar19 = (dVar44 - dVar25) * dVar18 -
               (((dVar24 - dVar14 * dVar25) - dVar25 * dVar18) - dVar14 * (dVar44 - dVar25));
      dVar25 = dStack_1038 - dVar19;
      dStack_1038 = (dStack_1038 - (dVar25 + (dStack_1038 - dVar25))) +
                    ((dStack_1038 - dVar25) - dVar19);
      dVar19 = dVar23 + dVar25;
      dVar23 = (dVar23 - (dVar19 - (dVar19 - dVar23))) + (dVar25 - (dVar19 - dVar23));
      dVar25 = dVar23 - dVar24;
      dStack_1030 = (dVar23 - (dVar25 + (dVar23 - dVar25))) + ((dVar23 - dVar25) - dVar24);
      dStack_1020 = dVar19 + dVar25;
      dStack_1028 = (dVar19 - (dStack_1020 - (dStack_1020 - dVar19))) +
                    (dVar25 - (dStack_1020 - dVar19));
      dVar25 = dVar11 * splitter - (dVar11 * splitter - dVar11);
      dVar23 = (dVar11 - dVar25) * dVar18 -
               (((dVar26 - dVar14 * dVar25) - dVar25 * dVar18) - dVar14 * (dVar11 - dVar25));
      dVar25 = splitter * dVar15 - (splitter * dVar15 - dVar15);
      dVar25 = (dVar15 - dVar25) * dVar34 -
               (-dVar43 * (dVar15 - dVar25) + dVar25 * -dVar34 + -dVar43 * dVar25 + dVar22);
      dVar43 = dVar23 - dVar25;
      dStack_1058 = (dVar23 - (dVar43 + (dVar23 - dVar43))) + ((dVar23 - dVar43) - dVar25);
      dVar25 = dVar26 + dVar43;
      dVar43 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar43 - (dVar25 - dVar26));
      dVar26 = dVar43 - dVar22;
      dStack_1050 = (dVar43 - (dVar26 + (dVar43 - dVar26))) + ((dVar43 - dVar26) - dVar22);
      dStack_1040 = dVar25 + dVar26;
      dStack_1048 = (dVar25 - (dStack_1040 - (dStack_1040 - dVar25))) +
                    (dVar26 - (dStack_1040 - dVar25));
      iVar3 = 4;
      goto LAB_0015c9dc;
    }
    dVar25 = -dVar16;
    dStack_1050 = dVar15 * dVar25;
    dVar26 = splitter * dVar25 - (dVar16 + splitter * dVar25);
    dVar43 = dVar15 * splitter - (dVar15 * splitter - dVar15);
    dStack_1058 = (dVar15 - dVar43) * (dVar25 - dVar26) -
                  (((dStack_1050 - dVar26 * dVar43) - dVar43 * (dVar25 - dVar26)) -
                  dVar26 * (dVar15 - dVar43));
    dStack_1030 = dVar23;
  }
  else {
    if ((dVar41 == 0.0) && (!NAN(dVar41))) {
      dStack_1038 = 0.0;
      dStack_1058 = 0.0;
      iVar3 = 1;
      goto LAB_0015c9dc;
    }
    dVar22 = -dVar41;
    dVar25 = splitter * dVar22 - (dVar41 + splitter * dVar22);
    dVar43 = dVar44 * splitter - (dVar44 * splitter - dVar44);
    dStack_1038 = (dVar44 - dVar43) * (dVar22 - dVar25) -
                  (((dVar44 * dVar22 - dVar25 * dVar43) - dVar43 * (dVar22 - dVar25)) -
                  dVar25 * (dVar44 - dVar43));
    dVar43 = dVar41 * splitter - (dVar41 * splitter - dVar41);
    dVar25 = splitter * dVar11 - (splitter * dVar11 - dVar11);
    dStack_1058 = (dVar11 - dVar25) * (dVar41 - dVar43) -
                  (((dVar26 - dVar43 * dVar25) - dVar25 * (dVar41 - dVar43)) -
                  dVar43 * (dVar11 - dVar25));
    dStack_1050 = dVar26;
    dStack_1030 = dVar44 * dVar22;
  }
  iVar3 = 2;
LAB_0015c9dc:
  iVar4 = fast_expansion_sum_zeroelim(iVar2,&dStack_ff8,iVar3,&dStack_1058,adStack_db8);
  iVar5 = scale_expansion_zeroelim(iVar4,adStack_db8,dVar10,adStack_f18);
  pdVar8 = adStack_638;
  iVar5 = fast_expansion_sum_zeroelim(elen,pdVar7,iVar5,adStack_f18,pdVar8);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,&dStack_1038,iVar1,&dStack_fd8,adStack_df8);
  flen = scale_expansion_zeroelim(iVar3,adStack_df8,dVar37,adStack_f18);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,pdVar8,flen,adStack_f18,pdVar7);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,&dStack_fb8,iVar2,&dStack_1018,adStack_e38);
  iVar2 = scale_expansion_zeroelim(iVar1,adStack_e38,dVar33,adStack_f18);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,pdVar7,iVar2,adStack_f18,pdVar8);
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    iVar5 = scale_expansion_zeroelim(4,&dStack_f38,dVar31,adStack_e98);
    pdVar7 = adStack_638;
    pdVar8 = adStack_c38;
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,iVar5,adStack_e98,pdVar8);
  }
  if ((dVar30 != 0.0) || (e = pdVar8, NAN(dVar30))) {
    iVar5 = scale_expansion_zeroelim(4,&dStack_f58,dVar30,adStack_e98);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,iVar5,adStack_e98,pdVar7);
    e = pdVar7;
    pdVar7 = pdVar8;
  }
  if ((dVar13 != 0.0) || (pdVar8 = pdVar7, NAN(dVar13))) {
    iVar5 = scale_expansion_zeroelim(4,&dStack_f78,dVar13,adStack_e98);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar5,adStack_e98,pdVar7);
    pdVar8 = e;
    e = pdVar7;
  }
  if ((dVar45 != 0.0) || (NAN(dVar45))) {
    if ((dVar38 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar38))) {
      dVar34 = dVar45 * dVar38;
      dVar26 = dVar45 * splitter - (dVar45 * splitter - dVar45);
      dVar25 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar24 = (dVar38 - dVar25) * (dVar45 - dVar26) -
               (((dVar34 - dVar26 * dVar25) - dVar25 * (dVar45 - dVar26)) -
               dVar26 * (dVar38 - dVar25));
      dVar43 = dVar33 * splitter - (dVar33 * splitter - dVar33);
      dVar22 = dVar33 - dVar43;
      dVar25 = dVar33 * dVar24;
      dVar26 = splitter * dVar24 - (splitter * dVar24 - dVar24);
      dStack_1088 = (dVar24 - dVar26) * dVar22 -
                    (((dVar25 - dVar26 * dVar43) - (dVar24 - dVar26) * dVar43) - dVar26 * dVar22);
      dVar23 = dVar34 * dVar33;
      dVar26 = splitter * dVar34 - (splitter * dVar34 - dVar34);
      dVar26 = (dVar34 - dVar26) * dVar22 -
               (((dVar23 - dVar26 * dVar43) - dVar43 * (dVar34 - dVar26)) - dVar26 * dVar22);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar23 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar23);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&dStack_1088,pdVar8);
      if ((dVar13 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar13))) {
        dVar43 = dVar13 * splitter - (dVar13 * splitter - dVar13);
        dVar22 = dVar13 - dVar43;
        dVar26 = dVar13 * dVar24;
        dVar25 = dVar24 * splitter - (dVar24 * splitter - dVar24);
        dStack_1088 = (dVar24 - dVar25) * dVar22 -
                      (((dVar26 - dVar25 * dVar43) - (dVar24 - dVar25) * dVar43) - dVar25 * dVar22);
        dVar23 = dVar34 * dVar13;
        dVar25 = splitter * dVar34 - (splitter * dVar34 - dVar34);
        dVar25 = (dVar34 - dVar25) * dVar22 -
                 (((dVar23 - dVar25 * dVar43) - dVar43 * (dVar34 - dVar25)) - dVar25 * dVar22);
        dStack_1078 = dVar26 + dVar25;
        dStack_1080 = (dVar26 - (dStack_1078 - (dStack_1078 - dVar26))) +
                      (dVar25 - (dStack_1078 - dVar26));
        dStack_1070 = dVar23 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar23);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&dStack_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar41 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar41))) {
      dVar26 = -dVar45;
      dVar23 = dVar41 * dVar26;
      dVar25 = splitter * dVar26 - (dVar45 + splitter * dVar26);
      dVar43 = dVar41 * splitter - (dVar41 * splitter - dVar41);
      dVar24 = (dVar41 - dVar43) * (dVar26 - dVar25) -
               (((dVar23 - dVar25 * dVar43) - dVar43 * (dVar26 - dVar25)) -
               dVar25 * (dVar41 - dVar43));
      dVar43 = dVar37 * splitter - (dVar37 * splitter - dVar37);
      dVar45 = dVar37 - dVar43;
      dVar25 = dVar37 * dVar24;
      dVar26 = splitter * dVar24 - (splitter * dVar24 - dVar24);
      dStack_1088 = (dVar24 - dVar26) * dVar45 -
                    (((dVar25 - dVar26 * dVar43) - (dVar24 - dVar26) * dVar43) - dVar26 * dVar45);
      dVar22 = dVar37 * dVar23;
      dVar26 = splitter * dVar23 - (splitter * dVar23 - dVar23);
      dVar26 = (dVar23 - dVar26) * dVar45 -
               (((dVar22 - dVar26 * dVar43) - dVar43 * (dVar23 - dVar26)) - dVar26 * dVar45);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar22 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar22);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&dStack_1088,pdVar7);
      if ((dVar30 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar30))) {
        dVar43 = dVar30 * splitter - (dVar30 * splitter - dVar30);
        dVar45 = dVar30 - dVar43;
        dVar26 = dVar30 * dVar24;
        dVar25 = dVar24 * splitter - (dVar24 * splitter - dVar24);
        dStack_1088 = (dVar24 - dVar25) * dVar45 -
                      (((dVar26 - dVar25 * dVar43) - (dVar24 - dVar25) * dVar43) - dVar25 * dVar45);
        dVar22 = dVar23 * dVar30;
        dVar25 = splitter * dVar23 - (splitter * dVar23 - dVar23);
        dVar25 = (dVar23 - dVar25) * dVar45 -
                 (((dVar22 - dVar25 * dVar43) - dVar43 * (dVar23 - dVar25)) - dVar25 * dVar45);
        dStack_1078 = dVar26 + dVar25;
        dStack_1080 = (dVar26 - (dStack_1078 - (dStack_1078 - dVar26))) +
                      (dVar25 - (dStack_1078 - dVar26));
        dStack_1070 = dVar22 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar22);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&dStack_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    if ((dVar41 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar41))) {
      dVar23 = dVar17 * dVar41;
      dVar26 = dVar17 * splitter - (dVar17 * splitter - dVar17);
      dVar25 = dVar41 * splitter - (dVar41 * splitter - dVar41);
      dVar22 = (dVar41 - dVar25) * (dVar17 - dVar26) -
               (((dVar23 - dVar26 * dVar25) - dVar25 * (dVar17 - dVar26)) -
               dVar26 * (dVar41 - dVar25));
      dVar41 = dVar10 * splitter - (dVar10 * splitter - dVar10);
      dVar43 = dVar10 - dVar41;
      dVar25 = dVar10 * dVar22;
      dVar26 = splitter * dVar22 - (splitter * dVar22 - dVar22);
      dStack_1088 = (dVar22 - dVar26) * dVar43 -
                    (((dVar25 - dVar26 * dVar41) - (dVar22 - dVar26) * dVar41) - dVar26 * dVar43);
      dVar45 = dVar10 * dVar23;
      dVar26 = splitter * dVar23 - (splitter * dVar23 - dVar23);
      dVar26 = (dVar23 - dVar26) * dVar43 -
               (((dVar45 - dVar26 * dVar41) - dVar41 * (dVar23 - dVar26)) - dVar26 * dVar43);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar45 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar45);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&dStack_1088,pdVar8);
      if ((dVar31 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar31))) {
        dVar25 = dVar31 * splitter - (dVar31 * splitter - dVar31);
        dVar41 = dVar31 - dVar25;
        dVar45 = dVar31 * dVar22;
        dVar26 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        dStack_1088 = (dVar22 - dVar26) * dVar41 -
                      (((dVar45 - dVar26 * dVar25) - (dVar22 - dVar26) * dVar25) - dVar26 * dVar41);
        dVar43 = dVar23 * dVar31;
        dVar26 = splitter * dVar23 - (splitter * dVar23 - dVar23);
        dVar26 = (dVar23 - dVar26) * dVar41 -
                 (((dVar43 - dVar26 * dVar25) - dVar25 * (dVar23 - dVar26)) - dVar26 * dVar41);
        dStack_1078 = dVar45 + dVar26;
        dStack_1080 = (dVar45 - (dStack_1078 - (dStack_1078 - dVar45))) +
                      (dVar26 - (dStack_1078 - dVar45));
        dStack_1070 = dVar43 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar43);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&dStack_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar12 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar12))) {
      dVar26 = -dVar17;
      dVar22 = dVar12 * dVar26;
      dVar25 = splitter * dVar26 - (dVar17 + splitter * dVar26);
      dVar41 = dVar12 * splitter - (dVar12 * splitter - dVar12);
      dVar45 = (dVar12 - dVar41) * (dVar26 - dVar25) -
               (((dVar22 - dVar25 * dVar41) - dVar41 * (dVar26 - dVar25)) -
               dVar25 * (dVar12 - dVar41));
      dVar41 = dVar33 * splitter - (dVar33 * splitter - dVar33);
      dVar43 = dVar33 - dVar41;
      dVar25 = dVar33 * dVar45;
      dVar26 = splitter * dVar45 - (splitter * dVar45 - dVar45);
      dStack_1088 = (dVar45 - dVar26) * dVar43 -
                    (((dVar25 - dVar26 * dVar41) - (dVar45 - dVar26) * dVar41) - dVar26 * dVar43);
      dVar33 = dVar33 * dVar22;
      dVar26 = splitter * dVar22 - (splitter * dVar22 - dVar22);
      dVar26 = (dVar22 - dVar26) * dVar43 -
               (((dVar33 - dVar26 * dVar41) - dVar41 * (dVar22 - dVar26)) - dVar26 * dVar43);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar33 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar33);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&dStack_1088,pdVar7);
      if ((dVar13 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar13))) {
        dVar41 = dVar13 * splitter - (dVar13 * splitter - dVar13);
        dVar43 = dVar13 - dVar41;
        dVar26 = dVar13 * dVar45;
        dVar25 = dVar45 * splitter - (dVar45 * splitter - dVar45);
        dStack_1088 = (dVar45 - dVar25) * dVar43 -
                      (((dVar26 - dVar25 * dVar41) - (dVar45 - dVar25) * dVar41) - dVar25 * dVar43);
        dVar45 = dVar22 * dVar13;
        dVar25 = splitter * dVar22 - (splitter * dVar22 - dVar22);
        dVar25 = (dVar22 - dVar25) * dVar43 -
                 (((dVar45 - dVar25 * dVar41) - dVar41 * (dVar22 - dVar25)) - dVar25 * dVar43);
        dStack_1078 = dVar26 + dVar25;
        dStack_1080 = (dVar26 - (dStack_1078 - (dStack_1078 - dVar26))) +
                      (dVar25 - (dStack_1078 - dVar26));
        dStack_1070 = dVar45 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar45);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&dStack_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar16 != 0.0) || (NAN(dVar16))) {
    if ((dVar12 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar12))) {
      dVar22 = dVar16 * dVar12;
      dVar26 = dVar16 * splitter - (dVar16 * splitter - dVar16);
      dVar25 = dVar12 * splitter - (dVar12 * splitter - dVar12);
      dVar45 = (dVar12 - dVar25) * (dVar16 - dVar26) -
               (((dVar22 - dVar26 * dVar25) - dVar25 * (dVar16 - dVar26)) -
               dVar26 * (dVar12 - dVar25));
      dVar41 = dVar37 * splitter - (dVar37 * splitter - dVar37);
      dVar43 = dVar37 - dVar41;
      dVar25 = dVar37 * dVar45;
      dVar26 = splitter * dVar45 - (splitter * dVar45 - dVar45);
      dStack_1088 = (dVar45 - dVar26) * dVar43 -
                    (((dVar25 - dVar26 * dVar41) - (dVar45 - dVar26) * dVar41) - dVar26 * dVar43);
      dVar37 = dVar37 * dVar22;
      dVar26 = splitter * dVar22 - (splitter * dVar22 - dVar22);
      dVar26 = (dVar22 - dVar26) * dVar43 -
               (((dVar37 - dVar26 * dVar41) - dVar41 * (dVar22 - dVar26)) - dVar26 * dVar43);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar37 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar37);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&dStack_1088,pdVar8);
      if ((dVar30 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar30))) {
        dVar41 = dVar30 * splitter - (dVar30 * splitter - dVar30);
        dVar43 = dVar30 - dVar41;
        dVar26 = dVar30 * dVar45;
        dVar25 = dVar45 * splitter - (dVar45 * splitter - dVar45);
        dStack_1088 = (dVar45 - dVar25) * dVar43 -
                      (((dVar26 - dVar25 * dVar41) - (dVar45 - dVar25) * dVar41) - dVar25 * dVar43);
        dVar45 = dVar22 * dVar30;
        dVar25 = splitter * dVar22 - (splitter * dVar22 - dVar22);
        dVar25 = (dVar22 - dVar25) * dVar43 -
                 (((dVar45 - dVar25 * dVar41) - dVar41 * (dVar22 - dVar25)) - dVar25 * dVar43);
        dStack_1078 = dVar26 + dVar25;
        dStack_1080 = (dVar26 - (dStack_1078 - (dStack_1078 - dVar26))) +
                      (dVar25 - (dStack_1078 - dVar26));
        dStack_1070 = dVar45 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar45);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&dStack_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar38 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar38))) {
      dVar26 = -dVar16;
      dVar45 = dVar38 * dVar26;
      dVar25 = splitter * dVar26 - (dVar16 + splitter * dVar26);
      dVar41 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar43 = (dVar38 - dVar41) * (dVar26 - dVar25) -
               (((dVar45 - dVar25 * dVar41) - dVar41 * (dVar26 - dVar25)) -
               dVar25 * (dVar38 - dVar41));
      dVar38 = dVar10 * splitter - (dVar10 * splitter - dVar10);
      dVar41 = dVar10 - dVar38;
      dVar25 = dVar10 * dVar43;
      dVar26 = splitter * dVar43 - (splitter * dVar43 - dVar43);
      dStack_1088 = (dVar43 - dVar26) * dVar41 -
                    (((dVar25 - dVar26 * dVar38) - (dVar43 - dVar26) * dVar38) - dVar26 * dVar41);
      dVar10 = dVar10 * dVar45;
      dVar26 = splitter * dVar45 - (splitter * dVar45 - dVar45);
      dVar26 = (dVar45 - dVar26) * dVar41 -
               (((dVar10 - dVar26 * dVar38) - dVar38 * (dVar45 - dVar26)) - dVar26 * dVar41);
      dStack_1078 = dVar26 + dVar25;
      dStack_1080 = (dVar25 - (dStack_1078 - (dStack_1078 - dVar25))) +
                    (dVar26 - (dStack_1078 - dVar25));
      dStack_1070 = dVar10 + dStack_1078;
      dStack_1078 = dStack_1078 - (dStack_1070 - dVar10);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&dStack_1088,pdVar7);
      if ((dVar31 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar31))) {
        dVar25 = dVar31 * splitter - (dVar31 * splitter - dVar31);
        dVar38 = dVar31 - dVar25;
        dVar12 = dVar31 * dVar43;
        dVar26 = dVar43 * splitter - (dVar43 * splitter - dVar43);
        dStack_1088 = (dVar43 - dVar26) * dVar38 -
                      (((dVar12 - dVar26 * dVar25) - (dVar43 - dVar26) * dVar25) - dVar26 * dVar38);
        dVar41 = dVar45 * dVar31;
        dVar26 = splitter * dVar45 - (splitter * dVar45 - dVar45);
        dVar26 = (dVar45 - dVar26) * dVar38 -
                 (((dVar41 - dVar26 * dVar25) - dVar25 * (dVar45 - dVar26)) - dVar26 * dVar38);
        dStack_1078 = dVar12 + dVar26;
        dStack_1080 = (dVar12 - (dStack_1078 - (dStack_1078 - dVar12))) +
                      (dVar26 - (dStack_1078 - dVar12));
        dStack_1070 = dVar41 + dStack_1078;
        dStack_1078 = dStack_1078 - (dStack_1070 - dVar41);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&dStack_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar31 != 0.0) || (pdVar7 = pdVar8, NAN(dVar31))) {
    iVar4 = scale_expansion_zeroelim(iVar4,adStack_db8,dVar31,adStack_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar4,adStack_f18,pdVar8);
    pdVar7 = e;
    e = pdVar8;
  }
  if ((dVar30 != 0.0) || (pdVar8 = e, NAN(dVar30))) {
    iVar3 = scale_expansion_zeroelim(iVar3,adStack_df8,dVar30,adStack_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar3,adStack_f18,pdVar7);
    pdVar8 = pdVar7;
    pdVar7 = e;
  }
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    iVar1 = scale_expansion_zeroelim(iVar1,adStack_e38,dVar13,adStack_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,iVar1,adStack_f18,pdVar7);
    pdVar8 = pdVar7;
  }
  return pdVar8[(long)iVar2 + -1];
}

Assistant:

REAL orient3d(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;


  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  adz = pa[2] - pd[2];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  bdz = pb[2] - pd[2];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy) 
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    //if (fabs(det) > o3dstaticfilter) return det;
    if (det > o3dstaticfilter) return det;
    if (det < -o3dstaticfilter) return det;
  }


  REAL permanent, errbound;

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}